

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsharedpointer.cpp
# Opt level: O0

void QtSharedPointer::internalSafetyCheckRemove(void *d_ptr)

{
  const_iterator it_00;
  const_iterator it_01;
  bool bVar1;
  Data<QHashPrivate::Node<const_volatile_void_*,_const_void_*>_> *pDVar2;
  undefined8 in_RDI;
  long in_FS_OFFSET;
  KnownPointers *kp;
  const_iterator it2;
  const_iterator it;
  QMutexLocker<QMutex> lock;
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_knownPointers>_>
  *in_stack_fffffffffffffef8;
  undefined4 in_stack_ffffffffffffff00;
  int in_stack_ffffffffffffff04;
  const_iterator *in_stack_ffffffffffffff08;
  QMessageLogger *in_stack_ffffffffffffff10;
  size_t *this;
  size_t in_stack_ffffffffffffff68;
  QMessageLogger local_60;
  piter local_40;
  piter local_30;
  undefined8 local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = in_RDI;
  pDVar2 = (Data<QHashPrivate::Node<const_volatile_void_*,_const_void_*>_> *)
           QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_knownPointers>_>::
           operator()(in_stack_fffffffffffffef8);
  if (pDVar2 != (Data<QHashPrivate::Node<const_volatile_void_*,_const_void_*>_> *)0x0) {
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    QMutexLocker<QMutex>::QMutexLocker
              ((QMutexLocker<QMutex> *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00)
               ,(QMutex *)in_stack_fffffffffffffef8);
    local_30.bucket = (size_t)&DAT_aaaaaaaaaaaaaaaa;
    local_30.d = (Data<QHashPrivate::Node<const_void_*,_(anonymous_namespace)::Data>_> *)
                 &DAT_aaaaaaaaaaaaaaaa;
    local_30 = (piter)QHash<const_void_*,_(anonymous_namespace)::Data>::constFind
                                ((QHash<const_void_*,_(anonymous_namespace)::Data> *)
                                 CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                                 (void **)in_stack_fffffffffffffef8);
    local_40 = (piter)QHash<const_void_*,_(anonymous_namespace)::Data>::cend
                                ((QHash<const_void_*,_(anonymous_namespace)::Data> *)
                                 in_stack_ffffffffffffff08);
    bVar1 = QHash<const_void_*,_(anonymous_namespace)::Data>::const_iterator::operator==
                      (in_stack_ffffffffffffff08,
                       (const_iterator *)
                       CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
    if (bVar1) {
      QMessageLogger::QMessageLogger
                (in_stack_ffffffffffffff10,(char *)in_stack_ffffffffffffff08,
                 in_stack_ffffffffffffff04,(char *)in_stack_fffffffffffffef8);
      QMessageLogger::fatal
                (&local_60,
                 "QSharedPointer: internal self-check inconsistency: pointer %p was not tracked. To use QT_SHAREDPOINTER_TRACK_POINTERS, you have to enable it throughout in your code."
                 ,local_20);
    }
    this = &pDVar2->numBuckets;
    QHash<const_void_*,_(anonymous_namespace)::Data>::const_iterator::operator->
              ((const_iterator *)0x62fef5);
    QHash<const_volatile_void_*,_const_void_*>::constFind
              ((QHash<const_volatile_void_*,_const_void_*> *)
               CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
               (void **)in_stack_fffffffffffffef8);
    it_00.i.bucket = in_stack_ffffffffffffff68;
    it_00.i.d = pDVar2;
    QHash<const_volatile_void_*,_const_void_*>::erase
              ((QHash<const_volatile_void_*,_const_void_*> *)this,it_00);
    it_01.i.bucket = (size_t)local_30.d;
    it_01.i.d = (Data<QHashPrivate::Node<const_void_*,_(anonymous_namespace)::Data>_> *)pDVar2;
    QHash<const_void_*,_(anonymous_namespace)::Data>::erase
              ((QHash<const_void_*,_(anonymous_namespace)::Data> *)this,it_01);
    QMutexLocker<QMutex>::~QMutexLocker
              ((QMutexLocker<QMutex> *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00)
              );
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QtSharedPointer::internalSafetyCheckRemove(const void *d_ptr)
{
    KnownPointers *const kp = knownPointers();
    if (!kp)
        return;                 // end-game: the application is being destroyed already

    QMutexLocker lock(&kp->mutex);

    const auto it = kp->dPointers.constFind(d_ptr);
    if (Q_UNLIKELY(it == kp->dPointers.cend())) {
        qFatal("QSharedPointer: internal self-check inconsistency: pointer %p was not tracked. "
               "To use QT_SHAREDPOINTER_TRACK_POINTERS, you have to enable it throughout "
               "in your code.", d_ptr);
    }

    const auto it2 = kp->dataPointers.constFind(it->pointer);
    Q_ASSERT(it2 != kp->dataPointers.cend());

    //qDebug("Removing d=%p value=%p", d_ptr, it->pointer);

    // remove entries
    kp->dataPointers.erase(it2);
    kp->dPointers.erase(it);
    Q_ASSERT(kp->dPointers.size() == kp->dataPointers.size());
}